

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

int luaF_close(lua_State *L,StkId level,int status)

{
  StkId level_00;
  undefined8 uVar1;
  StkId pTVar2;
  long *plVar3;
  bool bVar4;
  TValue *io2;
  TValue *io1;
  TValue *slot;
  ptrdiff_t levelrel;
  UpVal uv1;
  UpVal *uv;
  StkId pTStack_18;
  int status_local;
  StkId level_local;
  lua_State *L_local;
  
  uv._4_4_ = status;
  pTStack_18 = level;
  do {
    while( true ) {
      bVar4 = false;
      if (L->openupval != (UpVal *)0x0) {
        uv1.u._8_8_ = L->openupval;
        bVar4 = pTStack_18 <= ((UpVal *)uv1.u._8_8_)->v;
      }
      if (!bVar4) {
        return uv._4_4_;
      }
      if (*(long *)uv1.u._8_8_ == uv1.u._8_8_ + 0x10) {
        __assert_fail("((uv)->v != &(uv)->u.value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                      ,0x9f,"int luaF_close(lua_State *, StkId, int)");
      }
      L->openupval = *(UpVal **)(uv1.u._8_8_ + 0x10);
      if (*(int *)(uv1.u._8_8_ + 8) != 0) break;
      level_00 = *(StkId *)uv1.u._8_8_;
      uVar1 = *(undefined8 *)(uv1.u._8_8_ + 8);
      luaM_realloc_(L,(void *)uv1.u._8_8_,0x20,0);
      if (((uv._4_4_ != -1) && (uv1.v._4_4_ = (int)((ulong)uVar1 >> 0x20), uv1.v._4_4_ != 0)) &&
         ((level_00->tt_ & 0xf) == 6)) {
        pTVar2 = L->stack;
        uv._4_4_ = calldeferredfunction(L,level_00,uv._4_4_);
        pTStack_18 = (StkId)((long)L->stack + ((long)pTStack_18 - (long)pTVar2));
      }
    }
    plVar3 = (long *)(uv1.u._8_8_ + 0x10);
    *plVar3 = **(long **)uv1.u._8_8_;
    *(short *)(uv1.u._8_8_ + 0x18) = (short)(*(long **)uv1.u._8_8_)[1];
    if ((*(ushort *)(uv1.u._8_8_ + 0x18) & 0x8000) != 0) {
      if ((*(ushort *)(uv1.u._8_8_ + 0x18) & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                      ,0xac,"int luaF_close(lua_State *, StkId, int)");
      }
      if ((*(ushort *)(uv1.u._8_8_ + 0x18) & 0x7f) != (ushort)*(byte *)(*plVar3 + 8)) {
LAB_00121c2e:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                      ,0xac,"int luaF_close(lua_State *, StkId, int)");
      }
      if (L != (lua_State *)0x0) {
        if ((*(ushort *)(uv1.u._8_8_ + 0x18) & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                        ,0xac,"int luaF_close(lua_State *, StkId, int)");
        }
        if ((*(byte *)(*plVar3 + 9) & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00121c2e;
      }
    }
    *(long **)uv1.u._8_8_ = plVar3;
    if (((*(ushort *)(uv1.u._8_8_ + 0x18) & 0x8000) != 0) &&
       (*(long *)uv1.u._8_8_ == uv1.u._8_8_ + 0x10)) {
      if ((*(ushort *)(uv1.u._8_8_ + 0x18) & 0x8000) == 0) {
        __assert_fail("(((slot)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                      ,0xae,"int luaF_close(lua_State *, StkId, int)");
      }
      luaC_upvalbarrier_(L,(GCObject *)*plVar3);
    }
  } while( true );
}

Assistant:

int luaF_close (lua_State *L, StkId level, int status) {
  UpVal *uv;
  while (L->openupval != NULL && (uv = L->openupval)->v >= level) {
    lua_assert(upisopen(uv));
    L->openupval = uv->u.open.next; /* remove from 'open' list */
    if (uv->refcount == 0) {        /* no references? */
      UpVal uv1 = *uv;              /* copy the upvalue as we will free it below */
      luaM_free(L, uv);             /* free upvalue before invoking any deferred functions */
      if (status != NOCLOSINGMETH && uv1.flags && ttisfunction(uv1.v)) {
        ptrdiff_t levelrel = savestack(L, level);
        status = calldeferredfunction(L, uv1.v, status);
        level = restorestack(L, levelrel);
      }
    }
    else {
      TValue* slot = &uv->u.value;  /* new position for value */
      setobj(L, slot, uv->v);  /* move value to upvalue slot */
      uv->v = slot;  /* now current value lives here */
      luaC_upvalbarrier(L, uv, slot);
    }
  }
  return status;
}